

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O1

bool __thiscall
ON__LayerExtensions::Read(ON__LayerExtensions *this,ON_BinaryArchive *binary_archive)

{
  ON_SimpleArray<ON__LayerPerViewSettings> *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ON_Layer *this_01;
  ON__LayerPerViewSettings *pOVar4;
  long lVar5;
  int iVar6;
  ON_Layer *layer;
  int count;
  int major_version;
  int minor_version;
  uint local_3c;
  int local_38 [2];
  
  if (-1 < (this->m_vp_settings).m_capacity) {
    (this->m_vp_settings).m_count = 0;
  }
  bVar2 = false;
  local_38[0] = 0;
  local_38[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(binary_archive,0x40008000,local_38,local_38 + 1);
  if (bVar1) {
    this_01 = (ON_Layer *)ON_UserData::Owner(&this->super_ON_UserData);
    if (this_01 == (ON_Layer *)0x0) {
      layer = (ON_Layer *)0x0;
    }
    else {
      bVar1 = ON_Object::IsKindOf((ON_Object *)this_01,&ON_Layer::m_ON_Layer_class_rtti);
      layer = (ON_Layer *)0x0;
      if (bVar1) {
        layer = this_01;
      }
    }
    bVar1 = false;
    if ((layer != (ON_Layer *)0x0) && (bVar1 = false, local_38[0] == 1)) {
      local_3c = 0;
      bVar1 = ON_BinaryArchive::ReadInt(binary_archive,(ON__INT32 *)&local_3c);
      if (bVar1) {
        this_00 = &this->m_vp_settings;
        if ((uint)(this->m_vp_settings).m_capacity < local_3c) {
          ON_SimpleArray<ON__LayerPerViewSettings>::SetCapacity(this_00,(long)(int)local_3c);
        }
        if (0 < (int)local_3c) {
          iVar6 = 0;
          do {
            pOVar4 = ON_SimpleArray<ON__LayerPerViewSettings>::AppendNew(this_00);
            bVar1 = ON__LayerPerViewSettings::Read(pOVar4,layer,binary_archive);
            if (!bVar1) {
              (*(this->m_vp_settings)._vptr_ON_SimpleArray[2])
                        (this_00,(ulong)((this->m_vp_settings).m_count - 1));
              break;
            }
            lVar5 = (long)(this->m_vp_settings).m_count;
            pOVar4 = (this->m_vp_settings).m_a + lVar5 + -1;
            if (lVar5 < 1) {
              pOVar4 = (ON__LayerPerViewSettings *)0x0;
            }
            uVar3 = ON__LayerPerViewSettings::SettingsMask(pOVar4);
            if (uVar3 == 0) {
              (*(this->m_vp_settings)._vptr_ON_SimpleArray[2])
                        (this_00,(ulong)((this->m_vp_settings).m_count - 1));
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < (int)local_3c);
        }
        ON_SimpleArray<ON__LayerPerViewSettings>::QuickSort
                  (this_00,ON__LayerPerViewSettings::Compare);
      }
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(binary_archive);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

bool ON__LayerExtensions::Read(ON_BinaryArchive& binary_archive)
{
  m_vp_settings.SetCount(0);

  int major_version = 0;
  int minor_version = 0;
  bool rc = binary_archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if ( !rc )
    return false;

  for(;;)
  {
    const ON_Layer* layer = ON_Layer::Cast( Owner() );
    rc = ( 0 != layer );
    if (!rc) break;

    rc = (1 == major_version);
    if (!rc) break;

    int count = 0;
    rc = binary_archive.ReadInt(&count);
    if ( !rc ) break;
    m_vp_settings.Reserve(count);
    for ( int i = 0; i < count; i++ )
    {
      rc = m_vp_settings.AppendNew().Read(*layer,binary_archive);
      if (!rc) 
      {
        m_vp_settings.Remove();
        break;
      }
      if ( 0 == m_vp_settings.Last()->SettingsMask() )
        m_vp_settings.Remove();
    }

    // to make ON_Layer::PerViewportSettingsCRC() return
    // equal values for equal settings, it is critical
    // that m_vp_settings[] be sorted.
    m_vp_settings.QuickSort(ON__LayerPerViewSettings::Compare);

    if (!rc) break;

    break;
  }

  if ( !binary_archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}